

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  size_t N;
  int n;
  ulong local_40;
  int local_34;
  
  do {
    printf("Enter how many numbers you\'d like to input (3-10): ");
    iVar2 = __isoc99_scanf("%zu",&local_40);
    if (iVar2 == 0) {
      puts("Not a valid number!");
      iVar2 = 0;
      __isoc99_scanf("%*[^\n]");
    }
    else if (iVar2 == 1) {
      iVar2 = 3;
      if (7 < local_40 - 3) {
        puts("Must be between 3 and 10!");
        iVar2 = 0;
      }
    }
    else {
      putchar(10);
      iVar2 = 1;
    }
  } while (iVar2 == 0);
  if (iVar2 == 3) {
    bVar5 = local_40 != 0;
    if (local_40 == 0) {
      uVar3 = 0;
    }
    else {
      uVar4 = 0;
      uVar3 = 0;
      do {
        printf("%zu-th number: ",uVar4 + 1);
        iVar2 = __isoc99_scanf("%d",&local_34);
        if (iVar2 == -1) {
          putchar(10);
          bVar1 = false;
        }
        else {
          if (iVar2 == 0) {
            puts("Not a valid number!");
            __isoc99_scanf("%*[^\n]");
            uVar4 = uVar4 - 1;
          }
          else {
            uVar3 = uVar3 + local_34;
          }
          bVar1 = true;
        }
        if (!bVar1) break;
        uVar4 = uVar4 + 1;
        bVar5 = uVar4 < local_40;
      } while (bVar5);
    }
    if (!bVar5) {
      printf("The sum of these numbers is %d.\n",(ulong)uVar3);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  size_t N;

  while (true) { // Input N
    printf("Enter how many numbers you'd like to input (3-10): ");
    int res = scanf("%zu", &N);
    if (res == 1) {
      if (N > 2 && N < 11) break;
      else {
        printf("Must be between 3 and 10!\n");
      }
    } else if (res == 0) {
      printf("Not a valid number!\n");
      scanf("%*[^\n]");
    } else {
      printf("\n");
      return 0;
    }
  }

  int sum = 0;

  for (size_t i = 0; i < N; i++) { // input each number and add it to sum
    int n;
    printf("%zu-th number: ", i + 1);

    const int res = scanf("%d", &n);
    if (res == 0) {
      printf("Not a valid number!\n");
      scanf("%*[^\n]");
      i--;
    } else if (res == EOF) {
      printf("\n");
      return 0;
    } else {
      sum += n;
    }
  }

  printf("The sum of these numbers is %d.\n", sum);

  return 0;
}